

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mod.hpp
# Opt level: O0

uint boost::random::const_mod<unsigned_int,_2147483647U>::mult_general(uint a,uint b)

{
  uint uVar1;
  ulong m;
  unsigned_long uVar2;
  uintmax_t uVar3;
  uint in_ESI;
  uint in_EDI;
  uint modulus;
  uint suppress_warnings;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  undefined4 local_4;
  
  uVar4 = 0;
  uVar1 = 0x7fffffff;
  m = 0x7fffffff;
  uVar2 = std::numeric_limits<unsigned_long>::max();
  if (uVar2 / uVar1 < m) {
    uVar3 = detail::mulmod(CONCAT44(in_ESI,uVar4),CONCAT44(uVar1,in_stack_ffffffffffffffe8),m);
    local_4 = (uint)uVar3;
  }
  else {
    local_4 = (uint)(((ulong)in_EDI * (ulong)in_ESI) % (ulong)uVar1);
  }
  return local_4;
}

Assistant:

static IntType mult_general(IntType a, IntType b)
  {
    IntType suppress_warnings = (m == 0);
    BOOST_ASSERT(suppress_warnings == 0);
    IntType modulus = m + suppress_warnings;
    BOOST_ASSERT(modulus == m);
    if(::boost::uintmax_t(modulus) <=
        (::std::numeric_limits< ::boost::uintmax_t>::max)() / modulus)
    {
      return static_cast<IntType>(boost::uintmax_t(a) * b % modulus);
    } else {
      return static_cast<IntType>(detail::mulmod(a, b, modulus));
    }
  }